

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O2

bool cmExecProgramCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  string *psVar11;
  Encoding in_R9D;
  bool bVar12;
  int iVar13;
  pointer pbVar14;
  bool bVar15;
  string_view value;
  string_view value_00;
  int retVal;
  cmExecutionStatus *local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_188;
  string output;
  string command;
  string output_variable;
  string arguments;
  string return_variable;
  string coutput;
  string local_70;
  string local_50;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar14 == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&coutput,"called with incorrect number of arguments",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&coutput);
    bVar15 = false;
  }
  else {
    arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
    arguments._M_string_length = 0;
    arguments.field_2._M_local_buf[0] = '\0';
    output_variable._M_dataplus._M_p = (pointer)&output_variable.field_2;
    output_variable._M_string_length = 0;
    return_variable._M_dataplus._M_p = (pointer)&return_variable.field_2;
    return_variable._M_string_length = 0;
    output_variable.field_2._M_local_buf[0] = '\0';
    return_variable.field_2._M_local_buf[0] = '\0';
    bVar12 = false;
    iVar13 = 0;
    bVar6 = false;
    bVar5 = false;
    local_190 = status;
    local_188 = args;
    for (; pvVar2 = local_188, bVar15 = pbVar14 == pbVar1, !bVar15; pbVar14 = pbVar14 + 1) {
      bVar4 = std::operator==(pbVar14,"OUTPUT_VARIABLE");
      if (bVar4) {
        iVar13 = iVar13 + 1;
LAB_001e1b58:
        bVar12 = false;
LAB_001e1b5b:
        bVar6 = false;
      }
      else if (bVar5 == false) {
        bVar5 = std::operator==(pbVar14,"RETURN_VALUE");
        if (bVar5) {
          iVar13 = iVar13 + 1;
          bVar12 = true;
          goto LAB_001e1b5b;
        }
        if (bVar12) {
          if (return_variable._M_string_length != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&coutput,"called with incorrect number of arguments",
                       (allocator<char> *)&command);
            std::__cxx11::string::_M_assign((string *)&local_190->Error);
            goto LAB_001e1ef9;
          }
          std::__cxx11::string::_M_assign((string *)&return_variable);
        }
        else {
          bVar15 = std::operator==(pbVar14,"ARGS");
          if (!bVar15) {
            if (!bVar6) goto LAB_001e1b58;
            std::__cxx11::string::append((string *)&arguments);
            std::__cxx11::string::append((char *)&arguments);
          }
          bVar6 = true;
        }
        iVar13 = iVar13 + 1;
        bVar12 = false;
      }
      else {
        if (output_variable._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&coutput,"called with incorrect number of arguments",
                     (allocator<char> *)&command);
          std::__cxx11::string::_M_assign((string *)&local_190->Error);
LAB_001e1ef9:
          psVar11 = &coutput;
          goto LAB_001e1f01;
        }
        std::__cxx11::string::_M_assign((string *)&output_variable);
        iVar13 = iVar13 + 1;
      }
      bVar5 = bVar4;
    }
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    command.field_2._M_local_buf[0] = '\0';
    if (arguments._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&command);
    }
    else {
      cmSystemTools::ConvertToRunCommandPath
                (&output,(local_188->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
      retVal = CONCAT31(retVal._1_3_,0x20);
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string&>
                (&coutput,&output,(char *)&retVal,&arguments);
      std::__cxx11::string::operator=((string *)&command,(string *)&coutput);
      std::__cxx11::string::~string((string *)&coutput);
      std::__cxx11::string::~string((string *)&output);
    }
    sVar3 = output_variable._M_string_length;
    retVal = 0;
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    pbVar14 = (pvVar2->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(pvVar2->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5) - (long)iVar13 == 2
       ) {
      cmsys::SystemTools::MakeDirectory(pbVar14 + 1,(mode_t *)0x0);
      std::__cxx11::string::string((string *)&local_50,(string *)&command);
      bVar6 = anon_unknown.dwarf_368fc4::RunCommand
                        (&local_50,&output,&retVal,
                         (pvVar2->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,sVar3 == 0,
                         in_R9D);
      psVar11 = &local_50;
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&command);
      bVar6 = anon_unknown.dwarf_368fc4::RunCommand
                        (&local_70,&output,&retVal,(char *)0x0,sVar3 == 0,in_R9D);
      psVar11 = &local_70;
    }
    std::__cxx11::string::~string((string *)psVar11);
    if (bVar6 == false) {
      retVal = -1;
    }
    if (output_variable._M_string_length != 0) {
      uVar7 = std::__cxx11::string::find_first_not_of((char *)&output,0x67864d);
      lVar8 = std::__cxx11::string::find_last_not_of((char *)&output,0x67864d);
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = 0;
      }
      lVar10 = output._M_string_length - 1;
      if (lVar8 != -1) {
        lVar10 = lVar8;
      }
      std::__cxx11::string::string((string *)&coutput,(string *)&output,uVar7,(lVar10 - uVar7) + 1);
      value._M_str = coutput._M_dataplus._M_p;
      value._M_len = coutput._M_string_length;
      cmMakefile::AddDefinition(local_190->Makefile,&output_variable,value);
      std::__cxx11::string::~string((string *)&coutput);
    }
    if (return_variable._M_string_length != 0) {
      snprintf((char *)&coutput,100,"%d",(ulong)(uint)retVal);
      this = local_190->Makefile;
      sVar9 = strlen((char *)&coutput);
      value_00._M_str = (char *)&coutput;
      value_00._M_len = sVar9;
      cmMakefile::AddDefinition(this,&return_variable,value_00);
    }
    std::__cxx11::string::~string((string *)&output);
    psVar11 = &command;
LAB_001e1f01:
    std::__cxx11::string::~string((string *)psVar11);
    std::__cxx11::string::~string((string *)&return_variable);
    std::__cxx11::string::~string((string *)&output_variable);
    std::__cxx11::string::~string((string *)&arguments);
  }
  return bVar15;
}

Assistant:

bool cmExecProgramCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmStrCat(cmSystemTools::ConvertToRunCommandPath(args[0]), ' ',
                       arguments);
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = RunCommand(command, output, retVal, args[1].c_str(), verbose);
  } else {
    result = RunCommand(command, output, retVal, nullptr, verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    status.GetMakefile().AddDefinition(output_variable, coutput);
  }

  if (!return_variable.empty()) {
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%d", retVal);
    status.GetMakefile().AddDefinition(return_variable, buffer);
  }

  return true;
}